

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O1

sptr_t tga_write(sptr_t buf,image_data image,int expand)

{
  uchar *__dest;
  uint uVar1;
  long lVar2;
  ulong uVar3;
  uchar *puVar4;
  ulong uVar5;
  uchar *puVar6;
  long lVar7;
  long lVar8;
  uchar uVar9;
  uchar uVar10;
  bool bVar11;
  sptr_t sVar12;
  sptr_t sVar13;
  uchar *local_38;
  
  uVar3 = buf.size;
  puVar4 = buf.ptr;
  lVar2 = 0;
  if (((0xfd < (byte)(image.type - 3)) && (image.palette.data.ptr != (uchar *)0x0)) &&
     (image.palette.type == '\x01')) {
    if (expand == 0) {
      lVar2 = image.pixels.size + 0x312;
    }
    else {
      lVar2 = (4 - (ulong)(image.alpha_pixels == 0)) * image.pixels.size + 0x12;
    }
  }
  uVar5 = 0;
  puVar6 = (uchar *)0x0;
  if (lVar2 - 1U < uVar3) {
    memset(puVar4,0,uVar3);
    *puVar4 = '\0';
    bVar11 = expand == 0;
    puVar4[1] = bVar11;
    puVar6 = (uchar *)0x18;
    if (!bVar11) {
      puVar6 = (uchar *)0x0;
    }
    uVar10 = '\b';
    if (!bVar11) {
      uVar10 = (image.alpha_pixels != 0) * '\b' + '\x18';
    }
    puVar4[2] = '\x02' - bVar11;
    local_38 = puVar4 + 3;
    write_le16(0,&local_38);
    write_le16((ushort)bVar11 << 8,&local_38);
    *local_38 = (uchar)puVar6;
    local_38 = local_38 + 1;
    write_le16(0,&local_38);
    write_le16(0,&local_38);
    write_le16((uint16_t)image.width,&local_38);
    write_le16((uint16_t)image.height,&local_38);
    *local_38 = uVar10;
    __dest = puVar4 + 0x12;
    local_38[1] = ' ';
    uVar5 = uVar3;
    puVar6 = puVar4;
    if (expand == 0) {
      local_38 = local_38 + 1;
      memcpy(__dest,image.palette.data.ptr,image.palette.data.size);
      sVar12.size = uVar3 - 0x12;
      sVar12.ptr = __dest;
      sVar12 = sptr_slice(sVar12,0,image.palette.data.size);
      flip_bgr(sVar12);
      memcpy(__dest + image.palette.data.size,image.pixels.ptr,image.pixels.size);
    }
    else {
      uVar1 = (uint)image.pixels.size;
      if (image.alpha_pixels == 0) {
        if (0 < (int)uVar1) {
          puVar4 = puVar4 + 0x14;
          uVar3 = 0;
          do {
            lVar2 = (ulong)image.pixels.ptr[uVar3] * 3;
            puVar4[-2] = image.palette.data.ptr[lVar2 + 2];
            puVar4[-1] = image.palette.data.ptr[lVar2 + 1];
            *puVar4 = image.palette.data.ptr[lVar2];
            uVar3 = uVar3 + 1;
            puVar4 = puVar4 + 3;
          } while ((uVar1 & 0x7fffffff) != uVar3);
        }
      }
      else if (0 < (int)uVar1) {
        uVar3 = (ulong)(uVar1 & 0x7fffffff);
        lVar2 = 0;
        lVar7 = 0;
        do {
          if ((ulong)*image.pixels.ptr == 0xff) {
            lVar8 = lVar7 * 4;
            (puVar4 + lVar2 + 0x12)[0] = '\0';
            (puVar4 + lVar2 + 0x12)[1] = '\0';
            uVar10 = '\0';
            uVar9 = '\0';
          }
          else {
            lVar8 = (ulong)*image.pixels.ptr * 3;
            puVar4[lVar2 + 0x12] = image.palette.data.ptr[lVar8 + 2];
            puVar4[lVar2 + 0x13] = image.palette.data.ptr[lVar8 + 1];
            uVar10 = image.palette.data.ptr[lVar8];
            uVar9 = 0xff;
            lVar8 = lVar2;
          }
          puVar4[lVar8 + 0x14] = uVar10;
          puVar4[lVar8 + 0x15] = uVar9;
          lVar7 = lVar7 + 1;
          image.pixels.ptr = image.pixels.ptr + 1;
          lVar2 = lVar2 + 4;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
    }
  }
  sVar13.size = uVar5;
  sVar13.ptr = puVar6;
  return sVar13;
}

Assistant:

sptr_t tga_write(sptr_t buf, struct image_data image, int expand)
{
	size_t size = tga_estimate_size(image, expand);
	if (size == 0 || buf.size < size) {
		return SPTR_NULL;
	}
	memset(buf.ptr, 0, buf.size);
	sptr_t cm_offset = tga_write_header(buf, image, expand);
	if (!expand)
	{
		/* copy palette data */
		memcpy(cm_offset.ptr, image.palette.data.ptr, image.palette.data.size);
		/* flip from RGB to BGR in place */
		sptr_t cm_palette = sptr_slice(cm_offset, 0, image.palette.data.size);
		flip_bgr(cm_palette);
		/* copy pixel data */
		memcpy(cm_offset.ptr + image.palette.data.size, image.pixels.ptr,
			image.pixels.size);
	}
	else
	{
		unsigned char *buf = cm_offset.ptr;
		int num_pixels = image.pixels.size;
		if (image.alpha_pixels)
		{
			/* write BGRA */
			for (int i = 0; i < num_pixels; i++)
			{
				int j = image.pixels.ptr[i];

				if (j == 255)
				{
					// transparent, so scan around for another color
				    // to avoid alpha fringes
				    // FIXME: do a full flood fill so mips work...
					/*
				    if (i > image.width && image.pixels.ptr[i-image.width] != 255)
					    j = image.pixels.ptr[i-image.width];
				    else if (i < num_pixels-image.width && image.pixels.ptr[i+image.width] != 255)
					    j = image.pixels.ptr[i+image.width];
				    else if (i > 0 && image.pixels.ptr[i-1] != 255)
					    j = image.pixels.ptr[i-1];
				    else if (i < num_pixels-1 && image.pixels.ptr[i+1] != 255)
					    j = image.pixels.ptr[i+1];
				    else
					    j = 0;

					buf[i * 4 + 0] = image.palette.data.ptr[j * 3 + 2];
					buf[i * 4 + 1] = image.palette.data.ptr[j * 3 + 1];
					buf[i * 4 + 2] = image.palette.data.ptr[j * 3 + 0];
					*/
					buf[i * 4 + 0] = 0;
					buf[i * 4 + 1] = 0;
					buf[i * 4 + 2] = 0;
					buf[i * 4 + 3] = 0;
				}
				else
				{
					buf[i * 4 + 0] = image.palette.data.ptr[j * 3 + 2];
					buf[i * 4 + 1] = image.palette.data.ptr[j * 3 + 1];
					buf[i * 4 + 2] = image.palette.data.ptr[j * 3 + 0];
					buf[i * 4 + 3] = 255;
				}
			}
		}
		else
		{
			/* write BGR */
			for (int i = 0; i < num_pixels; i++)
			{
				int j = image.pixels.ptr[i] * 3;

				buf[i * 3 + 0] = image.palette.data.ptr[j + 2];
				buf[i * 3 + 1] = image.palette.data.ptr[j + 1];
				buf[i * 3 + 2] = image.palette.data.ptr[j + 0];
			}
		}
	}
	return buf;
}